

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_response::set_status_and_content_view<std::__cxx11::string>
          (coro_http_response *this,status_type status,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *content,
          content_encoding encoding,bool is_view,string_view client_encoding_type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  byte in_R8B;
  __sv_type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  size_t local_30;
  char *local_28;
  
  *in_RDI = in_ESI;
  if ((in_R8B & 1) == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_00000010,in_stack_00000008);
  }
  else {
    _Var1 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDX);
    local_30 = _Var1._M_len;
    *(size_t *)(in_RDI + 0x3c) = local_30;
    local_28 = _Var1._M_str;
    *(char **)(in_RDI + 0x3e) = local_28;
  }
  *(undefined1 *)(in_RDI + 0x28) = 1;
  return;
}

Assistant:

void set_status_and_content_view(
      status_type status, String content = "",
      content_encoding encoding = content_encoding::none, bool is_view = true,
      std::string_view client_encoding_type = "") {
    status_ = status;
#ifdef CINATRA_ENABLE_GZIP
    if (encoding == content_encoding::gzip) {
      if (client_encoding_type.empty() ||
          client_encoding_type.find("gzip") != std::string_view::npos) {
        std::string encode_str;
        bool r = gzip_codec::compress(content, encode_str);
        if (!r) {
          set_status_and_content(status_type::internal_server_error,
                                 "gzip compress error");
        }
        else {
          add_header("Content-Encoding", "gzip");
          set_content(std::move(encode_str));
        }
      }
      else {
        if (is_view) {
          content_view_ = content;
        }
        else {
          content_ = std::move(content);
        }
      }
      has_set_content_ = true;
      return;
    }

    if (encoding == content_encoding::deflate) {
      if (client_encoding_type.empty() ||
          client_encoding_type.find("deflate") != std::string_view::npos) {
        std::string deflate_str;
        bool r = gzip_codec::deflate(content, deflate_str);
        if (!r) {
          set_status_and_content(status_type::internal_server_error,
                                 "deflate compress error");
        }
        else {
          add_header("Content-Encoding", "deflate");
          set_content(std::move(deflate_str));
        }
      }
      else {
        if (is_view) {
          content_view_ = content;
        }
        else {
          content_ = std::move(content);
        }
      }
      has_set_content_ = true;
      return;
    }
#endif

#ifdef CINATRA_ENABLE_BROTLI
    if (encoding == content_encoding::br) {
      if (client_encoding_type.empty() ||
          client_encoding_type.find("br") != std::string_view::npos) {
        std::string br_str;
        bool r = br_codec::brotli_compress(content, br_str);
        if (!r) {
          set_status_and_content(status_type::internal_server_error,
                                 "br compress error");
        }
        else {
          add_header("Content-Encoding", "br");
          set_content(std::move(br_str));
        }
      }
      else {
        if (is_view) {
          content_view_ = content;
        }
        else {
          content_ = std::move(content);
        }
      }
      has_set_content_ = true;
      return;
    }
#endif

    if (is_view) {
      content_view_ = content;
    }
    else {
      content_ = std::move(content);
    }
    has_set_content_ = true;
  }